

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O3

void text_out_to_screen(uint8_t a,char *str)

{
  bool bVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  ulong uVar4;
  wchar_t wVar5;
  int iVar6;
  wchar_t wVar7;
  undefined7 in_register_00000039;
  wchar_t x;
  long lVar8;
  wchar_t wVar9;
  wchar_t *dest;
  wchar_t y;
  wchar_t h;
  wchar_t wid;
  wchar_t cv [256];
  wchar_t av [256];
  wchar_t buf [1024];
  wchar_t local_186c;
  wchar_t local_1868;
  wchar_t local_1864;
  uint local_1860;
  wchar_t local_185c;
  wchar_t *local_1858;
  wchar_t *local_1850;
  ulong local_1848;
  int local_1840;
  wchar_t local_183c;
  wchar_t awStack_1838 [512];
  wchar_t local_1038 [1026];
  
  uVar4 = CONCAT71(in_register_00000039,a) & 0xffffffff;
  Term_get_size(&local_183c,&local_1840);
  Term_locate(&local_186c,&local_1868);
  dest = local_1038;
  text_mbstowcs(dest,str,L'Ѐ');
  wVar9 = local_183c;
  if (text_out_wrap < local_183c) {
    wVar9 = text_out_wrap;
  }
  if (text_out_wrap < L'\x01') {
    wVar9 = local_183c;
  }
  wVar5 = wVar9 + L'\xffffffff';
  local_1848 = (ulong)(uint)(wVar9 + L'\xfffffffe');
  local_1850 = local_1038 + (local_1848 - 0x100);
  local_1858 = awStack_1838 + local_1848;
  local_1860 = (uint)CONCAT71(in_register_00000039,a);
  local_1864 = wVar5;
  do {
    wVar3 = *dest;
    if (wVar3 == L'\n') {
      local_186c = text_out_indent;
      local_1868 = local_1868 + L'\x01';
      Term_erase(text_out_indent,local_1868,L'ÿ');
      local_186c = local_186c + text_out_pad;
      Term_gotoxy(local_186c,local_1868);
    }
    else {
      if (wVar3 == L'\0') {
        return;
      }
      wVar3 = text_iswprint(wVar3);
      pwVar2 = local_1858;
      if (wVar3 == L'\0') {
        wVar3 = L' ';
      }
      else {
        wVar3 = *dest;
        if (wVar3 != L' ' && wVar5 <= local_186c) {
          local_185c = wVar3;
          if (local_186c < wVar9 && L'\x01' < wVar9) {
            Term_what((wchar_t)local_1848,local_1868,local_1850,local_1858);
            x = L'\0';
            wVar3 = *pwVar2;
            wVar7 = wVar5;
            while (wVar3 != L' ') {
              x = wVar7 + L'\xffffffff';
              if (x < L'\x01') goto LAB_001e3c8c;
              wVar7 = wVar7 + L'\xfffffffe';
              Term_what(wVar7,local_1868,local_1038 + ((ulong)(uint)wVar7 - 0x100),
                        awStack_1838 + (uint)wVar7);
              wVar3 = awStack_1838[(uint)wVar7];
              wVar7 = x;
            }
            if (x == L'\0') goto LAB_001e3c8c;
          }
          else {
LAB_001e3c8c:
            x = wVar9;
          }
          Term_erase(x,local_1868,L'ÿ');
          local_186c = text_out_indent;
          local_1868 = local_1868 + L'\x01';
          Term_erase(text_out_indent,local_1868,L'ÿ');
          local_186c = local_186c + text_out_pad;
          Term_gotoxy(local_186c,local_1868);
          if (x < wVar5) {
            iVar6 = local_1864 - x;
            lVar8 = 0;
            do {
              Term_addch(local_1038[(long)x + lVar8 + -0x100],awStack_1838[x + lVar8]);
              bVar1 = wVar9 <= local_186c;
              local_186c = local_186c + L'\x01';
              if (bVar1) {
                local_186c = wVar9;
              }
              lVar8 = lVar8 + 1;
            } while (iVar6 != (int)lVar8);
          }
          uVar4 = (ulong)local_1860;
          wVar5 = local_1864;
          wVar3 = local_185c;
        }
      }
      Term_addch((wchar_t)uVar4,wVar3);
      bVar1 = wVar9 <= local_186c;
      local_186c = local_186c + L'\x01';
      if (bVar1) {
        local_186c = wVar9;
      }
    }
    dest = dest + 1;
  } while( true );
}

Assistant:

void text_out_to_screen(uint8_t a, const char *str)
{
	int x, y;

	int wid, h;

	int wrap;

	const wchar_t *s;
	wchar_t buf[1024];

	/* Obtain the size */
	(void)Term_get_size(&wid, &h);

	/* Obtain the cursor */
	(void)Term_locate(&x, &y);

	/* Copy to a rewriteable string */
	text_mbstowcs(buf, str, 1024);
	
	/* Use special wrapping boundary? */
	if ((text_out_wrap > 0) && (text_out_wrap < wid))
		wrap = text_out_wrap;
	else
		wrap = wid;

	/* Process the string */
	for (s = buf; *s; s++) {
		wchar_t ch;

		/* Force wrap */
		if (*s == L'\n') {
			/* Wrap */
			x = text_out_indent;
			y++;

			/* Clear line, move cursor */
			Term_erase(x, y, 255);

			x += text_out_pad;
			Term_gotoxy(x, y);

			continue;
		}

		/* Clean up the char */
		ch = (text_iswprint(*s) ? *s : L' ');

		/* Wrap words as needed */
		if ((x >= wrap - 1) && (ch != L' ')) {
			int i, n = 0;

			int av[256];
			wchar_t cv[256];

			/* Wrap word */
			if (x < wrap) {
				/* Scan existing text */
				for (i = wrap - 2; i >= 0; i--) {
					/* Grab existing attr/char */
					Term_what(i, y, &av[i], &cv[i]);

					/* Break on space */
					if (cv[i] == L' ') break;

					/* Track current word */
					n = i;
				}
			}

			/* Special case */
			if (n == 0) n = wrap;

			/* Clear line */
			Term_erase(n, y, 255);

			/* Wrap */
			x = text_out_indent;
			y++;

			/* Clear line, move cursor */
			Term_erase(x, y, 255);

			x += text_out_pad;
			Term_gotoxy(x, y);

			/* Wrap the word (if any) */
			for (i = n; i < wrap - 1; i++) {
				/* Dump */
				Term_addch(av[i], cv[i]);

				/* Advance (no wrap) */
				if (++x > wrap) x = wrap;
			}
		}

		/* Dump */
		Term_addch(a, ch);

		/* Advance */
		if (++x > wrap) x = wrap;
	}
}